

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O2

int input_intelhex(char *fname,int *start,int *length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *__s;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  int local_6c;
  int local_68;
  int local_64;
  int lval;
  int ladr;
  int ll;
  int lt;
  ulong local_50;
  ulong local_48;
  int *local_40;
  int *local_38;
  
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    iVar2 = 0;
  }
  else {
    local_68 = 0x8000;
    local_6c = 0;
    do {
      do {
        do {
          memset(sline,0,0x100);
          uVar5 = 0;
          while( true ) {
            iVar2 = fgetc(__stream);
            if (uVar5 == 0xff) break;
            if (iVar2 == -1) goto LAB_00102507;
            if (iVar2 == 10) {
              bVar7 = uVar5 < 0xb;
              goto LAB_001023e5;
            }
            sline[uVar5] = (char)iVar2;
            uVar5 = uVar5 + 1;
          }
          if (iVar2 == -1) {
LAB_00102507:
            *length = local_6c;
            *start = local_68;
            iVar2 = 1;
            goto LAB_00102519;
          }
          bVar7 = false;
LAB_001023e5:
          if ((bVar7) || (sline[0] != ':')) {
            __s = "Invalid Intel Hex format.";
            goto LAB_0010253d;
          }
          iVar2 = __isoc99_sscanf(sline,":%2x%4x%2x",&ll,&ladr,&lt);
        } while (iVar2 != 3);
      } while ((0x8000 < ladr + ll) || (lt != 0));
      local_64 = ladr + ll + (ladr >> 8);
      iVar2 = 9;
      lVar6 = 0;
      local_50 = (ulong)(uint)ladr;
      local_48 = (ulong)(uint)ladr;
      local_40 = length;
      local_38 = start;
      while( true ) {
        iVar1 = ll;
        lVar4 = (long)ll;
        iVar3 = __isoc99_sscanf(sline + iVar2,"%2x",&lval);
        if (lVar4 <= lVar6) break;
        local_50 = (ulong)ladr;
        ebuf[local_50 + lVar6] = (uint8)lval;
        local_64 = local_64 + lval;
        lVar6 = lVar6 + 1;
        iVar2 = iVar2 + 2;
      }
      if (iVar3 == 0) break;
      if ((int)local_48 < local_68) {
        local_68 = (int)local_48;
      }
      iVar2 = (iVar1 - local_68) + (int)local_50;
      if (iVar2 <= local_6c) {
        iVar2 = local_6c;
      }
      length = local_40;
      start = local_38;
      local_6c = iVar2;
    } while ((-local_64 & 0xffU) == lval);
    __s = "Invalid checksum.";
LAB_0010253d:
    puts(__s);
    iVar2 = 0;
LAB_00102519:
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

int input_intelhex(char *fname, int *start, int *length)
{
   FILE *fp;
 
   int c, sc, retval = 1;
   int ll, ladr, lt, sn, i, lval;
   int hstart, hlength, sum;

   fp = fopen(fname, "r");
   if(fp == NULL) 
      return 0;
   hstart = MAXBUF;
   hlength = 0;
   sum = 0;
   do
   {
      memset(sline, 0x00, MAXSLENGTH);
      sc = 0;
      while (((c = fgetc(fp)) != EOF) && (c != 0x0A) && (sc < (MAXSLENGTH -1)))
         sline[sc++] = (uint8)c;
      if ((c != EOF) && ((sc < 11) || (sline[0] != ':')))
      {
         c = EOF;
         retval = 0;
         printf("Invalid Intel Hex format.\n");
      }
      if (c != EOF)
      {
         sn = sscanf(sline , ":%2x%4x%2x", &ll, &ladr, &lt);
         if ((sn == 3) && ((ladr + ll) <= MAXBUF) && (lt == 0))
         {
            sum = ll + (ladr >> 8) + (ladr & 0xff) + lt;
            if(ladr < hstart) hstart = ladr;
            for(i = 0; i < ll ; i++)
            {
               sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
               ebuf[ladr + i] = (uint8)lval;
               sum += (uint8)lval;
            }
            if(((ladr + ll) - hstart) > hlength)
               hlength = (ladr + ll) - hstart;
            sum = (0x100 - sum) & 0xff;
            sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
            if (!sn || ((sum - lval) != 0))
            {
               c = EOF;
               retval = 0;
               printf("Invalid checksum.\n");
            }
         }
      }      
   }
   while (c != EOF);
   if (retval)
   {
      *length = hlength;
      *start = hstart;
   }
   fclose(fp);
   
   return retval;
}